

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O3

bool __thiscall crnlib::ktx_texture::consistency_check(ktx_texture *this)

{
  uint32 uVar1;
  uint32 uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint32 uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint bytes_per_block;
  uint block_dim;
  uint local_5c;
  uint local_58;
  uint local_54 [9];
  
  bVar5 = check_header(this);
  if (!bVar5) {
    return false;
  }
  local_54[0] = 0;
  local_58 = 0;
  uVar1 = (this->m_header).m_glType;
  uVar2 = (this->m_header).m_glFormat;
  if (uVar1 == 0) {
    if (uVar2 != 0) {
      return false;
    }
    bVar5 = get_ogl_fmt_desc((this->m_header).m_glInternalFormat,0,local_54,&local_58);
    if (!bVar5 || local_54[0] == 1) {
      return false;
    }
  }
  else {
    if (uVar2 == 0) {
      return false;
    }
    bVar5 = get_ogl_fmt_desc(uVar2,uVar1,local_54,&local_58);
    if (1 < local_54[0] || !bVar5) {
      return false;
    }
  }
  if ((this->m_block_dim != local_54[0]) || (this->m_bytes_per_block != local_58)) {
    return false;
  }
  uVar3 = (this->m_header).m_numberOfMipmapLevels;
  uVar13 = uVar3 + (uVar3 == 0);
  uVar1 = (this->m_header).m_pixelDepth;
  uVar2 = (this->m_header).m_numberOfArrayElements;
  uVar17 = uVar1 + (uVar1 == 0);
  uVar1 = (this->m_header).m_numberOfFaces;
  iVar18 = uVar2 + (uVar2 == 0);
  if ((this->m_image_data).m_size != uVar17 * iVar18 * uVar1 * uVar13) {
    return false;
  }
  local_5c = 0;
  uVar2 = (this->m_header).m_pixelHeight;
  uVar8 = 0;
  do {
    bVar7 = (byte)uVar8;
    uVar11 = (this->m_header).m_pixelWidth >> (bVar7 & 0x1f);
    uVar6 = uVar2 + (uVar2 == 0) >> (bVar7 & 0x1f);
    uVar11 = uVar11 + (uVar11 == 0) + (local_54[0] - 1);
    if (uVar11 < local_54[0]) {
      return false;
    }
    uVar6 = uVar6 + (uVar6 == 0) + (local_54[0] - 1);
    if (uVar6 < local_54[0]) {
      return false;
    }
    uVar14 = uVar17 >> (bVar7 & 0x1f);
    iVar16 = 0;
    uVar15 = (ulong)(uVar14 + (uVar14 == 0));
    uVar14 = local_5c;
    do {
      if (uVar1 != 0) {
        uVar12 = 0;
        uVar10 = uVar15;
        uVar9 = uVar14;
        uVar4 = uVar14;
        do {
          do {
            if ((this->m_image_data).m_p[uVar9].m_size !=
                (uVar11 / local_54[0]) * (uVar6 / local_54[0]) * this->m_bytes_per_block) {
              return false;
            }
            uVar10 = uVar10 - 1;
            uVar9 = uVar9 + 1;
          } while (uVar10 != 0);
          uVar12 = uVar12 + 1;
          uVar9 = uVar4 + uVar17;
          uVar10 = uVar15;
          uVar4 = uVar9;
        } while (uVar12 != uVar1);
      }
      iVar16 = iVar16 + 1;
      uVar14 = uVar14 + uVar1 * uVar17;
    } while (iVar16 != iVar18);
    uVar8 = uVar8 + 1;
    local_5c = local_5c + uVar1 * uVar17 * iVar18;
  } while (uVar8 != uVar13);
  return uVar3 <= uVar8;
}

Assistant:

bool ktx_texture::consistency_check() const
    {
        if (!check_header())
        {
            return false;
        }

        uint block_dim = 0, bytes_per_block = 0;
        if ((!m_header.m_glType) || (!m_header.m_glFormat))
        {
            if ((m_header.m_glType) || (m_header.m_glFormat))
            {
                return false;
            }
            if (!get_ogl_fmt_desc(m_header.m_glInternalFormat, m_header.m_glType, block_dim, bytes_per_block))
            {
                return false;
            }
            if (block_dim == 1)
            {
                return false;
            }
            //if ((get_width() % block_dim) || (get_height() % block_dim))
            //   return false;
        }
        else
        {
            if (!get_ogl_fmt_desc(m_header.m_glFormat, m_header.m_glType, block_dim, bytes_per_block))
            {
                return false;
            }
            if (block_dim > 1)
            {
                return false;
            }
        }
        if ((m_block_dim != block_dim) || (m_bytes_per_block != bytes_per_block))
        {
            return false;
        }

        if (m_image_data.size() != get_total_images())
        {
            return false;
        }

        for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
        {
            uint mip_width, mip_height, mip_depth;
            get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

            const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
            const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
            if ((!mip_row_blocks) || (!mip_col_blocks))
            {
                return false;
            }

            for (uint array_element = 0; array_element < get_array_size(); array_element++)
            {
                for (uint face = 0; face < get_num_faces(); face++)
                {
                    for (uint zslice = 0; zslice < mip_depth; zslice++)
                    {
                        const uint8_vec& image_data = get_image_data(get_image_index(mip_level, array_element, face, zslice));

                        uint expected_image_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                        if (image_data.size() != expected_image_size)
                        {
                            return false;
                        }
                    }
                }
            }
        }

        return true;
    }